

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonReturnStringAsBlob(JsonString *pStr)

{
  _func_void_void_ptr *in_RDI;
  long in_FS_OFFSET;
  JsonParse px;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  sqlite3_context *pCtx;
  char local_21;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&stack0xffffffffffffffb0,0xaa,0x48);
  memset(&stack0xffffffffffffffb0,0,0x48);
  jsonStringTerminate((JsonString *)0x237734);
  if (in_RDI[0x21] == (_func_void_void_ptr)0x0) {
    pCtx = *(sqlite3_context **)(in_RDI + 8);
    sqlite3_context_db_handle(*(sqlite3_context **)in_RDI);
    jsonTranslateTextToBlob((JsonParse *)pStr,(u32)((ulong)lVar1 >> 0x20));
    if (local_21 == '\0') {
      sqlite3_result_blob(pCtx,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_RDI);
    }
    else {
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI)
      ;
      sqlite3_result_error_nomem((sqlite3_context *)0x2377a4);
    }
  }
  else {
    sqlite3_result_error_nomem((sqlite3_context *)0x23774a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonReturnStringAsBlob(JsonString *pStr){
  JsonParse px;
  memset(&px, 0, sizeof(px));
  jsonStringTerminate(pStr);
  if( pStr->eErr ){
    sqlite3_result_error_nomem(pStr->pCtx);
    return;
  }
  px.zJson = pStr->zBuf;
  px.nJson = pStr->nUsed;
  px.db = sqlite3_context_db_handle(pStr->pCtx);
  (void)jsonTranslateTextToBlob(&px, 0);
  if( px.oom ){
    sqlite3DbFree(px.db, px.aBlob);
    sqlite3_result_error_nomem(pStr->pCtx);
  }else{
    assert( px.nBlobAlloc>0 );
    assert( !px.bReadOnly );
    sqlite3_result_blob(pStr->pCtx, px.aBlob, px.nBlob, SQLITE_DYNAMIC);
  }
}